

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2ModDel::renderAux2Main(V2ModDel *this,StereoSample *dest,int nsamples)

{
  float l;
  undefined4 local_28;
  float in;
  StereoSample x;
  int i;
  int nsamples_local;
  StereoSample *dest_local;
  V2ModDel *this_local;
  
  if ((this->wetout != 0.0) || (NAN(this->wetout))) {
    x.field_0.r = (float)nsamples;
    _i = dest;
    dest_local = (StereoSample *)this;
    for (x.field_0.l = 0.0; (int)x.field_0.l < (int)x.field_0.r;
        x.field_0.l = (float)((int)x.field_0.l + 1)) {
      l = this->inst->aux2buf[(int)x.field_0.l] + 3.8146973e-06;
      processSample(this,(StereoSample *)&stack0xffffffffffffffd8,l,l,0.0);
      _i[(int)x.field_0.l].field_0.l = (float)local_28 + _i[(int)x.field_0.l].field_0.l;
      *(float *)((long)_i + (long)(int)x.field_0.l * 8 + 4) =
           in + *(float *)((long)_i + (long)(int)x.field_0.l * 8 + 4);
    }
  }
  return;
}

Assistant:

void renderAux2Main(StereoSample *dest, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL aux->main");

        for (int i=0; i < nsamples; i++)
        {
            StereoSample x;

            float in = inst->aux2buf[i] + fcdcoffset;
            processSample(&x, in, in, 0.0f);

            dest[i].l += x.l;
            dest[i].r += x.r;
        }
    }